

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  size_type *psVar1;
  TestCase *pTVar2;
  TestInfo *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  pointer ppTVar6;
  FILE *__stream;
  pointer ppTVar7;
  bool bVar8;
  pointer ppTVar9;
  ulong uVar10;
  pointer ppTVar11;
  pointer pcVar12;
  ulong uVar13;
  stringstream stream;
  JsonUnitTestResultPrinter local_220;
  char *local_1f8 [2];
  char local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  ppTVar9 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar11 = (this->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar11 != ppTVar9) {
    uVar10 = 0;
    do {
      pTVar2 = ppTVar9[uVar10];
      ppTVar6 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar7 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar7 != ppTVar6) {
        bVar8 = false;
        uVar13 = 0;
        do {
          pTVar3 = ppTVar6[uVar13];
          if (pTVar3->matches_filter_ == true) {
            if (!bVar8) {
              printf("%s.",(pTVar2->name_)._M_dataplus._M_p);
              pbVar4 = (pTVar2->type_param_).ptr_;
              if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar4->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar5 = 0x133392;
                printf("  # %s = ");
                pbVar4 = (pTVar2->type_param_).ptr_;
                if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  pcVar12 = (char *)0x0;
                }
                else {
                  pcVar12 = (pbVar4->_M_dataplus)._M_p;
                }
                PrintOnOneLine(pcVar12,iVar5);
              }
              putchar(10);
            }
            printf("  %s",(pTVar3->name_)._M_dataplus._M_p);
            pbVar4 = (pTVar3->value_param_).ptr_;
            if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar4->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar5 = 0x1333f8;
              printf("  # %s = ");
              pbVar4 = (pTVar3->value_param_).ptr_;
              if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                pcVar12 = (char *)0x0;
              }
              else {
                pcVar12 = (pbVar4->_M_dataplus)._M_p;
              }
              PrintOnOneLine(pcVar12,iVar5);
            }
            putchar(10);
            ppTVar6 = (pTVar2->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppTVar7 = (pTVar2->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar8 = true;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)((long)ppTVar7 - (long)ppTVar6 >> 3));
        ppTVar9 = (this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar11 = (this->test_cases_).
                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)ppTVar11 - (long)ppTVar9 >> 3));
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  iVar5 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar5 != 0) {
    iVar5 = std::__cxx11::string::compare((char *)local_1d8);
    if (iVar5 != 0) goto LAB_00119aae;
  }
  UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)local_1b8,
             (char *)local_220.super_EmptyTestEventListener.super_TestEventListener.
                     _vptr_TestEventListener,(allocator *)local_1f8);
  __stream = (FILE *)OpenFileForWriting((string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  psVar1 = &local_220.output_file_._M_string_length;
  if (local_220.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
      (TestEventListener)psVar1) {
    operator_delete((void *)local_220.super_EmptyTestEventListener.super_TestEventListener.
                            _vptr_TestEventListener);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  iVar5 = std::__cxx11::string::compare((char *)local_1d8);
  if (iVar5 == 0) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
              ((XmlUnitTestResultPrinter *)&local_220,local_1f8[0]);
    XmlUnitTestResultPrinter::PrintXmlTestsList((ostream *)(local_1b8 + 0x10),&this->test_cases_);
    local_220.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener =
         (TestEventListener)&PTR__XmlUnitTestResultPrinter_001480e0;
LAB_00119a33:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.output_file_._M_dataplus._M_p != &local_220.output_file_.field_2) {
      operator_delete(local_220.output_file_._M_dataplus._M_p);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0]);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)local_1d8);
    if (iVar5 == 0) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(&local_220,local_1f8[0]);
      JsonUnitTestResultPrinter::PrintJsonTestList((ostream *)(local_1b8 + 0x10),&this->test_cases_)
      ;
      local_220.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener =
           (TestEventListener)&PTR__JsonUnitTestResultPrinter_00148168;
      goto LAB_00119a33;
    }
  }
  StringStreamToString((string *)&local_220,(stringstream *)local_1b8);
  fputs((char *)local_220.super_EmptyTestEventListener.super_TestEventListener.
                _vptr_TestEventListener,__stream);
  if (local_220.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
      (TestEventListener)psVar1) {
    operator_delete((void *)local_220.super_EmptyTestEventListener.super_TestEventListener.
                            _vptr_TestEventListener);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00119aae:
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  return;
}

Assistant:

const char* String::Utf16ToAnsi(LPCWSTR utf16_str)  {
  if (!utf16_str) return NULL;
  const int ansi_length =
      WideCharToMultiByte(CP_ACP, 0, utf16_str, -1,
                          NULL, 0, NULL, NULL);
  char* ansi = new char[ansi_length + 1];
  WideCharToMultiByte(CP_ACP, 0, utf16_str, -1,
                      ansi, ansi_length, NULL, NULL);
  ansi[ansi_length] = 0;
  return ansi;
}